

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void * set_new(t_symbol *why,int argc,t_atom *argv)

{
  int iVar1;
  t_object *owner;
  t_symbol *ptVar2;
  _outlet *p_Var3;
  void *pvVar4;
  t_atom *local_50;
  t_atom *varvec;
  t_atom at;
  t_setvariable *sp;
  int varcount;
  int i;
  t_set *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *why_local;
  
  owner = (t_object *)pd_new(set_class);
  if (((argc == 0) || (argv->a_type != A_SYMBOL)) ||
     (iVar1 = strcmp(((argv->a_w).w_symbol)->s_name,"-symbol"), iVar1 != 0)) {
    *(undefined4 *)((long)&owner[1].te_inlet + 4) = 0;
    x = (t_set *)argv;
    argv_local._4_4_ = argc;
  }
  else {
    *(undefined4 *)((long)&owner[1].te_inlet + 4) = 1;
    argv_local._4_4_ = argc + -1;
    x = (t_set *)(argv + 1);
  }
  ptVar2 = atom_getsymbolarg(0,argv_local._4_4_,(t_atom *)x);
  p_Var3 = (_outlet *)template_getbindsym(ptVar2);
  owner[1].te_outlet = p_Var3;
  if (argv_local._4_4_ < 2) {
    sp._0_4_ = 1;
    local_50 = (t_atom *)&varvec;
    varvec._0_4_ = 2;
    at._0_8_ = &s_;
  }
  else {
    sp._0_4_ = argv_local._4_4_ + -1;
    local_50 = (t_atom *)&(x->x_obj).te_binbuf;
  }
  pvVar4 = getbytes((long)(int)sp << 4);
  *(void **)&owner[1].te_xpix = pvVar4;
  *(int *)&owner[1].te_inlet = (int)sp;
  sp._4_4_ = 0;
  at.a_w = *(word *)&owner[1].te_xpix;
  for (; sp._4_4_ < (int)sp; sp._4_4_ = sp._4_4_ + 1) {
    ptVar2 = atom_getsymbolarg(sp._4_4_,(int)sp,local_50);
    (at.a_w.w_symbol)->s_name = (char *)ptVar2;
    if (*(int *)((long)&owner[1].te_inlet + 4) == 0) {
      (at.a_w.w_gpointer)->gp_valid = 0;
    }
    else {
      (at.a_w.w_symbol)->s_thing = (_class **)&s_;
    }
    if (sp._4_4_ != 0) {
      if (*(int *)((long)&owner[1].te_inlet + 4) == 0) {
        floatinlet_new(owner,(t_float *)&(at.a_w.w_gpointer)->gp_valid);
      }
      else {
        symbolinlet_new(owner,(t_symbol **)&(at.a_w.w_binbuf)->b_vec);
      }
    }
    at.a_w.w_symbol = (t_symbol *)&(at.a_w.w_symbol)->s_next;
  }
  pointerinlet_new(owner,(t_gpointer *)(owner + 1));
  gpointer_init((t_gpointer *)(owner + 1));
  return owner;
}

Assistant:

static void *set_new(t_symbol *why, int argc, t_atom *argv)
{
    t_set *x = (t_set *)pd_new(set_class);
    int i, varcount;
    t_setvariable *sp;
    t_atom at, *varvec;
    if (argc && (argv[0].a_type == A_SYMBOL) &&
        !strcmp(argv[0].a_w.w_symbol->s_name, "-symbol"))
    {
        x->x_issymbol = 1;
        argc--;
        argv++;
    }
    else x->x_issymbol = 0;
    x->x_templatesym = template_getbindsym(atom_getsymbolarg(0, argc, argv));
    if (argc < 2)
    {
        varcount = 1;
        varvec = &at;
        SETSYMBOL(&at, &s_);
    }
    else varcount = argc - 1, varvec = argv + 1;
    x->x_variables
        = (t_setvariable *)getbytes(varcount * sizeof (*x->x_variables));
    x->x_nin = varcount;
    for (i = 0, sp = x->x_variables; i < varcount; i++, sp++)
    {
        sp->gv_sym = atom_getsymbolarg(i, varcount, varvec);
        if (x->x_issymbol)
            sp->gv_w.w_symbol = &s_;
        else sp->gv_w.w_float = 0;
        if (i)
        {
            if (x->x_issymbol)
                symbolinlet_new(&x->x_obj, &sp->gv_w.w_symbol);
            else floatinlet_new(&x->x_obj, &sp->gv_w.w_float);
        }
    }
    pointerinlet_new(&x->x_obj, &x->x_gp);
    gpointer_init(&x->x_gp);
    return (x);
}